

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.hpp
# Opt level: O2

void cimod::CheckVariables<int>(vector<int,_std::allocator<int>_> *configurations,Vartype *vartype)

{
  uint uVar1;
  int *piVar2;
  runtime_error *this;
  uint *puVar3;
  
  if (*vartype == BINARY) {
    puVar3 = (uint *)(configurations->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      if (puVar3 == (uint *)(configurations->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish) {
        return;
      }
      uVar1 = *puVar3;
      puVar3 = puVar3 + 1;
    } while (uVar1 < 2);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"The initial variables must be 0 or 1");
  }
  else if (*vartype == SPIN) {
    piVar2 = (configurations->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    while( true ) {
      if (piVar2 == (configurations->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        return;
      }
      if ((*piVar2 != -1) && (*piVar2 != 1)) break;
      piVar2 = piVar2 + 1;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"The initial variables must be -1 or +1");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unknown vartype detected");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CheckVariables( const std::vector<IntegerType> &configurations, const Vartype &vartype ) {
    if ( vartype == Vartype::SPIN ) {
      for ( const auto &v : configurations ) {
        if ( !( v == -1 || v == +1 ) ) {
          throw std::runtime_error( "The initial variables must be -1 or +1" );
        }
      }
    } else if ( vartype == Vartype::BINARY ) {
      for ( const auto &v : configurations ) {
        if ( !( v == 0 || v == 1 ) ) {
          throw std::runtime_error( "The initial variables must be 0 or 1" );
        }
      }
    } else {
      throw std::runtime_error( "Unknown vartype detected" );
    }
  }